

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O2

int SUNLinSolInitialize_SPGMR(SUNLinearSolver S)

{
  long lVar1;
  int *piVar2;
  int iVar3;
  N_Vector *pp_Var4;
  void *pvVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  
  if (S == (SUNLinearSolver)0x0) {
    return -1;
  }
  piVar2 = (int *)S->content;
  if (piVar2[3] < 0) {
    piVar2[3] = 0;
  }
  if (2 < piVar2[1] - 1U) {
    piVar2[1] = 0;
  }
  if (*(long *)(piVar2 + 0x18) == 0) {
    pp_Var4 = N_VCloneVectorArray(*piVar2 + 1,*(N_Vector *)(piVar2 + 0x22));
    *(N_Vector **)(piVar2 + 0x18) = pp_Var4;
    if (pp_Var4 != (N_Vector *)0x0) goto LAB_00118b64;
  }
  else {
LAB_00118b64:
    if (*(long *)(piVar2 + 0x1a) != 0) {
LAB_00118b6f:
      if (*(long *)(piVar2 + 0x1c) == 0) {
        pvVar5 = malloc((long)*piVar2 << 4);
        *(void **)(piVar2 + 0x1c) = pvVar5;
        if (pvVar5 == (void *)0x0) goto LAB_00118c64;
      }
      if (*(long *)(piVar2 + 0x20) == 0) {
        pvVar5 = malloc((long)*piVar2 * 8 + 8);
        *(void **)(piVar2 + 0x20) = pvVar5;
        if (pvVar5 == (void *)0x0) goto LAB_00118c64;
      }
      if (*(long *)(piVar2 + 0x24) == 0) {
        pvVar5 = malloc((long)*piVar2 * 8 + 8);
        *(void **)(piVar2 + 0x24) = pvVar5;
        if (pvVar5 == (void *)0x0) goto LAB_00118c64;
      }
      if (*(long *)(piVar2 + 0x26) == 0) {
        pvVar5 = malloc((long)*piVar2 * 8 + 8);
        *(void **)(piVar2 + 0x26) = pvVar5;
        if (pvVar5 == (void *)0x0) goto LAB_00118c64;
      }
      uVar6 = 0;
      iVar3 = 0;
      goto LAB_00118c72;
    }
    lVar7 = (long)*piVar2;
    pvVar5 = malloc(lVar7 * 8 + 8);
    *(void **)(piVar2 + 0x1a) = pvVar5;
    if (pvVar5 != (void *)0x0) {
      lVar8 = 0;
      do {
        if (lVar7 < lVar8) goto LAB_00118b6f;
        *(undefined8 *)((long)pvVar5 + lVar8 * 8) = 0;
        pvVar5 = malloc(lVar7 * 8);
        *(void **)(*(long *)(piVar2 + 0x1a) + lVar8 * 8) = pvVar5;
        pvVar5 = *(void **)(piVar2 + 0x1a);
        lVar1 = lVar8 * 8;
        lVar8 = lVar8 + 1;
      } while (*(long *)((long)pvVar5 + lVar1) != 0);
    }
  }
LAB_00118c64:
  SUNLinSolFree(S);
  iVar3 = -3;
  uVar6 = 0xfffffffffffffffd;
LAB_00118c72:
  *(undefined8 *)(piVar2 + 8) = uVar6;
  return iVar3;
}

Assistant:

int SUNLinSolInitialize_SPGMR(SUNLinearSolver S)
{
  int k;
  SUNLinearSolverContent_SPGMR content;

  /* set shortcut to SPGMR memory structure */
  if (S == NULL) return(SUNLS_MEM_NULL);  
  content = SPGMR_CONTENT(S);

  /* ensure valid options */
  if (content->max_restarts < 0) 
    content->max_restarts = SUNSPGMR_MAXRS_DEFAULT;
  if ( (content->pretype != PREC_LEFT) && 
       (content->pretype != PREC_RIGHT) && 
       (content->pretype != PREC_BOTH) )
    content->pretype = PREC_NONE;


  /* allocate solver-specific memory (where the size depends on the
     choice of maxl) here */

  /*   Krylov subspace vectors */
  if (content->V == NULL) {
    content->V = N_VCloneVectorArray(content->maxl+1, content->vtemp);
    if (content->V == NULL) {
      SUNLinSolFree(S);
      content->last_flag = SUNLS_MEM_FAIL;
      return(SUNLS_MEM_FAIL);
    }
  }
  
  /*   Hessenberg matrix Hes */
  if (content->Hes == NULL) {
    content->Hes = (realtype **) malloc((content->maxl+1)*sizeof(realtype *)); 
    if (content->Hes == NULL) {
      SUNLinSolFree(S);
      content->last_flag = SUNLS_MEM_FAIL;
      return(SUNLS_MEM_FAIL);
    }

    for (k=0; k<=content->maxl; k++) {
      content->Hes[k] = NULL;
      content->Hes[k] = (realtype *) malloc(content->maxl*sizeof(realtype));
      if (content->Hes[k] == NULL) {
        SUNLinSolFree(S);
        content->last_flag = SUNLS_MEM_FAIL;
        return(SUNLS_MEM_FAIL);
      }
    }
  }
  
  /*   Givens rotation components */
  if (content->givens == NULL) {
    content->givens = (realtype *) malloc(2*content->maxl*sizeof(realtype));
    if (content->givens == NULL) {
      SUNLinSolFree(S);
      content->last_flag = SUNLS_MEM_FAIL;
      return(SUNLS_MEM_FAIL);
    }
  }
  
  /*    y and g vectors */
  if (content->yg == NULL) {
    content->yg = (realtype *) malloc((content->maxl+1)*sizeof(realtype));
    if (content->yg == NULL) {
      SUNLinSolFree(S);
      content->last_flag = SUNLS_MEM_FAIL;
      return(SUNLS_MEM_FAIL);
    }
  }

  /*    cv vector for fused vector ops */
  if (content->cv == NULL) {
    content->cv = (realtype *) malloc((content->maxl+1)*sizeof(realtype));
    if (content->cv == NULL) {
      SUNLinSolFree(S);
      content->last_flag = SUNLS_MEM_FAIL;
      return(SUNLS_MEM_FAIL);
    }
  }

  /*    Xv vector for fused vector ops */
  if (content->Xv == NULL) {
    content->Xv = (N_Vector *) malloc((content->maxl+1)*sizeof(N_Vector));
    if (content->Xv == NULL) {
      SUNLinSolFree(S);
      content->last_flag = SUNLS_MEM_FAIL;
      return(SUNLS_MEM_FAIL);
    }
  }

  /* return with success */
  content->last_flag = SUNLS_SUCCESS;
  return(SUNLS_SUCCESS);
}